

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Record_Query_R_PDU::SetRecordIDs
          (Record_Query_R_PDU *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *ID)

{
  pointer puVar1;
  ulong uVar2;
  
  puVar1 = (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->m_vui32RecID,ID);
  uVar2 = (ulong)((long)(this->m_vui32RecID).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->m_vui32RecID).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  this->m_ui32NumRecs = (KUINT32)uVar2;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength =
       (short)uVar2 * 4 + 0x28;
  return;
}

Assistant:

void Record_Query_R_PDU::SetRecordIDs( const vector<KUINT32> & ID )
{
    m_vui32RecID.clear();
    m_vui32RecID = ID;
    m_ui32NumRecs = m_vui32RecID.size();
    m_ui16PDULength = RECORD_QUERY_R_PDU_SIZE + ( m_ui32NumRecs * 4 );
}